

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void wait_for_pending_write(CMConnection conn)

{
  CMControlList cl;
  FILE *pFVar1;
  int iVar2;
  int condition;
  __pid_t _Var3;
  pthread_t pVar4;
  timespec ts;
  timespec local_40;
  
  cl = conn->cm->control_list;
  iVar2 = CManager_locked(conn->cm);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(conn->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                  ,0xc2a,"void wait_for_pending_write(CMConnection)");
  }
  iVar2 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"Wait for pending write for conn %p\n",conn);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  if ((cl->has_thread == 0) || (pVar4 = pthread_self(), pVar4 == cl->server_thread)) {
    iVar2 = conn->write_pending;
    while ((iVar2 != 0 && (conn->closed == 0))) {
      iVar2 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)conn->cm->CMTrace_file;
          _Var3 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"Control list wait for conn %p\n",conn);
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      CMcontrol_list_wait(cl);
      iVar2 = conn->write_pending;
    }
  }
  else {
    iVar2 = conn->write_pending;
    while ((iVar2 != 0 && (conn->closed == 0))) {
      condition = INT_CMCondition_get(conn->cm,conn);
      add_pending_write_callback(conn,wake_pending_write,(void *)(long)condition);
      iVar2 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar2 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar2 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)conn->cm->CMTrace_file;
          _Var3 = getpid();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"Condition wait for conn %p\n",conn);
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      iVar2 = INT_CMCondition_wait(conn->cm,condition);
      if (iVar2 == 0) {
        conn->write_pending = 0;
      }
      iVar2 = conn->write_pending;
    }
  }
  iVar2 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"Done waiting for pending write for conn %p\n",conn);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  return;
}

Assistant:

void
 wait_for_pending_write(CMConnection conn)
 {
     CMControlList cl = conn->cm->control_list;
     assert(CManager_locked(conn->cm));
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Wait for pending write for conn %p\n", conn);

     if ((!cl->has_thread) || (thr_thread_self() == cl->server_thread)) {
	 /* single thread working, just poll network */
	 while(conn->write_pending && !conn->closed) {
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Control list wait for conn %p\n", conn);
	     CMcontrol_list_wait(cl);
	 }
     } else {
	 /* other thread is handling the network wait for it to wake us up */
	 while (conn->write_pending && !conn->closed) {
	     int cond = INT_CMCondition_get(conn->cm, conn);
	     add_pending_write_callback(conn, wake_pending_write, 
					(void*) (intptr_t)cond);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Condition wait for conn %p\n", conn);
	     if (INT_CMCondition_wait(conn->cm, cond) == 0) {
		 /* condition wait failed, connection is dead */
		 conn->write_pending = 0;
	     }
	 }
     }	    
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Done waiting for pending write for conn %p\n", conn);
 }